

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetupDebugger(cmake *this,string *connection)

{
  bool bVar1;
  int port;
  cmDebugger *pcVar2;
  char *pcVar3;
  cmDebuggerListener *local_70;
  cmDebugServerConsole *local_20;
  cmDebugServer *server;
  string *connection_local;
  cmake *this_local;
  
  if (this->Debugger == (cmDebugger *)0x0) {
    pcVar2 = cmDebugger::Create(this);
    this->Debugger = pcVar2;
    if (this->Debugger != (cmDebugger *)0x0) {
      bVar1 = std::operator==(connection,"stdin");
      if (bVar1) {
        local_20 = (cmDebugServerConsole *)operator_new(0x4a8);
        cmDebugServerConsole::cmDebugServerConsole(local_20,this->Debugger);
      }
      else {
        bVar1 = std::operator==(connection,"json-stdin");
        if (bVar1) {
          local_20 = (cmDebugServerConsole *)operator_new(0x4a0);
          cmDebugServerJson::cmDebugServerJson((cmDebugServerJson *)local_20,this->Debugger);
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)connection);
          if ((*pcVar3 < '0') ||
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)connection), '9' < *pcVar3))
          {
            local_20 = (cmDebugServerConsole *)operator_new(0x4a0);
            cmDebugServerJson::cmDebugServerJson
                      ((cmDebugServerJson *)local_20,this->Debugger,connection);
          }
          else {
            local_20 = (cmDebugServerConsole *)operator_new(0x4a0);
            pcVar2 = this->Debugger;
            port = std::__cxx11::stoi(connection,(size_t *)0x0,10);
            cmDebugServerJson::cmDebugServerJson((cmDebugServerJson *)local_20,pcVar2,port);
          }
        }
      }
      if (local_20 != (cmDebugServerConsole *)0x0) {
        local_70 = (cmDebuggerListener *)0x0;
        if (local_20 != (cmDebugServerConsole *)0x0) {
          local_70 = &(local_20->super_cmDebugServer).super_cmDebuggerListener;
        }
        (*this->Debugger->_vptr_cmDebugger[0x18])(this->Debugger,local_70);
        (*(local_20->super_cmDebugServer).super_cmServerBase._vptr_cmServerBase[5])();
      }
    }
  }
  return;
}

Assistant:

void cmake::SetupDebugger(const std::string& connection)
{
  if (this->Debugger) {
    return;
  }

  this->Debugger = cmDebugger::Create(*this);

  if (this->Debugger) {
    cmDebugServer* server = CM_NULLPTR;
    if (connection == "stdin") {
      server = new cmDebugServerConsole(*this->Debugger);
    } else if (connection == "json-stdin") {
      server = new cmDebugServerJson(*this->Debugger);
    } else if (connection[0] >= '0' && connection[0] <= '9') {
      server = new cmDebugServerJson(*this->Debugger, std::stoi(connection));
    } else {
      server = new cmDebugServerJson(*this->Debugger, connection);
    }

    if (server) {
      this->Debugger->AddListener(server);
      server->StartServeThread();
    }
  }
}